

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

void __thiscall tetgenmesh::meshsurface(tetgenmesh *this)

{
  uint *puVar1;
  uint uVar2;
  facet *pfVar3;
  int *piVar4;
  point pdVar5;
  char **ppcVar6;
  bool bVar7;
  point *ppdVar8;
  arraypool *this_00;
  arraypool *this_01;
  tetgenio *ptVar9;
  char *pcVar10;
  ulong uVar11;
  tetgenbehavior *ptVar12;
  uint uVar13;
  long lVar14;
  polygon *ppVar15;
  point pdVar16;
  int iVar17;
  polygon *ppVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  uint uVar22;
  facet *pfVar23;
  point *idx2verlist;
  long local_90;
  long local_80;
  point *local_50;
  long local_48;
  long local_40;
  facet *local_38;
  
  if (this->b->quiet == 0) {
    puts("Creating surface mesh ...");
  }
  makeindex2pointmap(this,&local_50);
  this_00 = (arraypool *)operator_new(0x30);
  this_00->objectbytes = 8;
  this_00->objectsperblock = 0x100;
  this_00->log2objectsperblock = 8;
  this_00->objectsperblockmark = 0xff;
  this_00->toparraylen = 0;
  this_00->toparray = (char **)0x0;
  this_00->objects = 0;
  this_00->totalmemory = 0;
  this_01 = (arraypool *)operator_new(0x30);
  ppdVar8 = local_50;
  this_01->objectbytes = 0x10;
  this_01->objectsperblock = 0x100;
  this_01->log2objectsperblock = 8;
  this_01->objectsperblockmark = 0xff;
  this_01->toparraylen = 0;
  this_01->toparray = (char **)0x0;
  this_01->objects = 0;
  this_01->totalmemory = 0;
  ptVar9 = this->in;
  if (0 < ptVar9->numberoffacets) {
    local_90 = 8;
    lVar21 = 1;
    do {
      pfVar3 = ptVar9->facetlist;
      pfVar23 = pfVar3 + lVar21 + -1;
      iVar17 = pfVar3[lVar21 + -1].numberofpolygons;
      if (this->dupverts < 1) {
LAB_0012a61f:
        if (0 < iVar17) {
          local_80 = 0;
          local_48 = 0;
          lVar14 = 0;
          local_38 = pfVar23;
          do {
            ppVar18 = local_38->polygonlist;
            uVar22 = *ppVar18[lVar14].vertexlist;
            iVar17 = this->in->firstnumber;
            local_40 = lVar14;
            if (((int)uVar22 < iVar17) || (iVar17 + this->in->numberofpoints <= (int)uVar22)) {
              if (this->b->quiet == 0) {
                printf("Warning:  Invalid the 1st vertex %d of polygon",(ulong)uVar22);
                printf(" %d in facet %d.\n",(ulong)((int)lVar14 + 1),lVar21);
              }
            }
            else {
              pdVar16 = ppdVar8[(int)uVar22];
              uVar13 = *(uint *)((long)pdVar16 + (long)this->pointmarkindex * 4 + 4);
              if ((uVar13 & 1) == 0) {
                *(uint *)((long)pdVar16 + (long)this->pointmarkindex * 4 + 4) = uVar13 | 1;
                pcVar10 = arraypool::getblock(this_00,(int)local_80);
                uVar11 = this_00->objects;
                local_90 = (long)this_00->objectbytes;
                local_80 = uVar11 + 1;
                this_00->objects = local_80;
                *(point *)(pcVar10 + ((long)this_00->objectsperblock - 1U & uVar11) * local_90) =
                     pdVar16;
              }
              ppVar18 = ppVar18 + lVar14;
              uVar11 = (ulong)(uint)ppVar18->numberofvertices;
              if (0 < ppVar18->numberofvertices) {
                uVar13 = (int)local_40 + 1;
                lVar14 = 1;
                do {
                  lVar20 = 0;
                  if (lVar14 < (int)uVar11) {
                    lVar20 = lVar14;
                  }
                  uVar2 = ppVar18->vertexlist[lVar20];
                  iVar17 = this->in->firstnumber;
                  if (((int)uVar2 < iVar17) || (iVar17 + this->in->numberofpoints <= (int)uVar2)) {
                    if (this->b->quiet == 0) {
                      printf("Warning:  Invalid vertex %d in polygon %d",(ulong)uVar2,(ulong)uVar13)
                      ;
LAB_0012a781:
                      printf(" in facet %d.\n",lVar21);
                    }
                  }
                  else if (uVar22 == uVar2) {
                    if ((2 < (int)uVar11) && (this->b->quiet == 0)) {
                      printf("Warning:  Polygon %d has two identical verts",(ulong)uVar13);
                      goto LAB_0012a781;
                    }
                  }
                  else {
                    pdVar5 = ppdVar8[(int)uVar2];
                    uVar22 = *(uint *)((long)pdVar5 + (long)this->pointmarkindex * 4 + 4);
                    if ((uVar22 & 1) == 0) {
                      *(uint *)((long)pdVar5 + (long)this->pointmarkindex * 4 + 4) = uVar22 | 1;
                      pcVar10 = arraypool::getblock(this_00,(int)local_80);
                      uVar11 = this_00->objects;
                      local_90 = (long)this_00->objectbytes;
                      local_80 = uVar11 + 1;
                      this_00->objects = local_80;
                      *(point *)(pcVar10 + ((long)this_00->objectsperblock - 1U & uVar11) * local_90
                                ) = pdVar5;
                    }
                    pcVar10 = arraypool::getblock(this_01,(int)local_48);
                    lVar20 = (long)this_01->objectbytes *
                             ((long)this_01->objectsperblock - 1U & this_01->objects);
                    local_48 = this_01->objects + 1;
                    this_01->objects = local_48;
                    *(point *)(pcVar10 + lVar20) = pdVar16;
                    *(point *)(pcVar10 + lVar20 + 8) = pdVar5;
                    pdVar16 = pdVar5;
                    uVar22 = uVar2;
                  }
                  uVar11 = (ulong)ppVar18->numberofvertices;
                } while ((uVar11 != 2) &&
                        (bVar7 = lVar14 < (long)uVar11, lVar14 = lVar14 + 1, bVar7));
              }
            }
            lVar14 = local_40 + 1;
          } while (lVar14 < local_38->numberofpolygons);
          pfVar23 = local_38;
          if (0 < local_80) {
            ppcVar6 = this_00->toparray;
            iVar17 = this_00->log2objectsperblock;
            uVar22 = this_00->objectsperblockmark;
            lVar14 = 0;
            do {
              puVar1 = (uint *)(*(long *)(ppcVar6[(uint)lVar14 >> ((byte)iVar17 & 0x1f)] +
                                         (int)((uVar22 & (uint)lVar14) * (int)local_90)) + 4 +
                               (long)this->pointmarkindex * 4);
              *puVar1 = *puVar1 & 0xfffffffe;
              lVar14 = lVar14 + 1;
            } while (local_80 != lVar14);
          }
        }
      }
      else if (0 < iVar17) {
        ppVar18 = pfVar23->polygonlist;
        lVar14 = 0;
        do {
          iVar19 = ppVar18[lVar14].numberofvertices;
          if (0 < iVar19) {
            ppVar15 = ppVar18 + lVar14;
            piVar4 = ppVar15->vertexlist;
            lVar20 = 0;
            do {
              if ((*(uint *)((long)ppdVar8[piVar4[lVar20]] + (long)this->pointmarkindex * 4 + 4) &
                  0xffffff00) == 0x100) {
                piVar4[lVar20] =
                     *(int *)((long)ppdVar8[piVar4[lVar20]][(long)this->point2simindex + 1] +
                             (long)this->pointmarkindex * 4);
                iVar19 = ppVar15->numberofvertices;
              }
              lVar20 = lVar20 + 1;
            } while (lVar20 < iVar19);
            iVar17 = pfVar3[lVar21 + -1].numberofpolygons;
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 < iVar17);
        goto LAB_0012a61f;
      }
      piVar4 = this->in->facetmarkerlist;
      if (piVar4 == (int *)0x0) {
        iVar17 = -1;
      }
      else {
        iVar17 = piVar4[lVar21 + -1];
      }
      triangulate(this,iVar17,this_00,this_01,pfVar23->numberofholes,pfVar23->holelist);
      this_00->objects = 0;
      this_01->objects = 0;
      ptVar9 = this->in;
      bVar7 = lVar21 < ptVar9->numberoffacets;
      lVar21 = lVar21 + 1;
    } while (bVar7);
  }
  ptVar12 = this->b;
  if (ptVar12->diagnose == 0) {
    unifysegments(this);
    if (0 < this->in->numberofedges) {
      identifyinputedges(this,local_50);
    }
    ptVar12 = this->b;
    if (((ptVar12->psc == 0) && (ptVar12->nomergefacet == 0)) &&
       ((ptVar12->nobisect == 0 || (ptVar12->nobisect_nomerge == 0)))) {
      mergefacets(this);
      ptVar12 = this->b;
    }
  }
  if (ptVar12->object == STL) {
    jettisonnodes(this);
    ptVar12 = this->b;
  }
  if (ptVar12->verbose != 0) {
    printf("  %ld (%ld) subfaces (segments).\n",this->subfaces->items,this->subsegs->items);
  }
  this->insegments = this->subsegs->items;
  if (local_50 != (point *)0x0) {
    operator_delete__(local_50);
  }
  arraypool::~arraypool(this_00);
  operator_delete(this_00,0x30);
  arraypool::~arraypool(this_01);
  operator_delete(this_01,0x30);
  return;
}

Assistant:

void tetgenmesh::meshsurface()
{
  arraypool *ptlist, *conlist;
  point *idx2verlist;
  point tstart, tend, *pnewpt, *cons;
  tetgenio::facet *f;
  tetgenio::polygon *p;
  int end1, end2;
  int shmark, i, j;

  if (!b->quiet) {
    printf("Creating surface mesh ...\n");
  }

  // Create a map from indices to points.
  makeindex2pointmap(idx2verlist);

  // Initialize arrays (block size: 2^8 = 256).
  ptlist = new arraypool(sizeof(point *), 8);
  conlist = new arraypool(2 * sizeof(point *), 8);

  // Loop the facet list, triangulate each facet.
  for (shmark = 1; shmark <= in->numberoffacets; shmark++) {

    // Get a facet F.
    f = &in->facetlist[shmark - 1];

    // Process the duplicated points first, they are marked with type
    //   DUPLICATEDVERTEX.  If p and q are duplicated, and p'index > q's,
    //   then p is substituted by q.
    if (dupverts > 0l) {
      // Loop all polygons of this facet.
      for (i = 0; i < f->numberofpolygons; i++) {
        p = &(f->polygonlist[i]);
        // Loop other vertices of this polygon.
        for (j = 0; j < p->numberofvertices; j++) {
          end1 = p->vertexlist[j];
          tstart = idx2verlist[end1];
          if (pointtype(tstart) == DUPLICATEDVERTEX) {
            // Reset the index of vertex-j.
            tend = point2ppt(tstart);
            end2 = pointmark(tend);
            p->vertexlist[j] = end2;
          }
        }
      }
    }

    // Loop polygons of F, get the set of vertices and segments.
    for (i = 0; i < f->numberofpolygons; i++) {
      // Get a polygon.
      p = &(f->polygonlist[i]);
      // Get the first vertex.
      end1 = p->vertexlist[0];
      if ((end1 < in->firstnumber) || 
          (end1 >= in->firstnumber + in->numberofpoints)) {
        if (!b->quiet) {
          printf("Warning:  Invalid the 1st vertex %d of polygon", end1);
          printf(" %d in facet %d.\n", i + 1, shmark);
        }
        continue; // Skip this polygon.
      }
      tstart = idx2verlist[end1];
      // Add tstart to V if it haven't been added yet.
      if (!pinfected(tstart)) {
        pinfect(tstart);
        ptlist->newindex((void **) &pnewpt);
        *pnewpt = tstart;
      }
      // Loop other vertices of this polygon.
      for (j = 1; j <= p->numberofvertices; j++) {
        // get a vertex.
        if (j < p->numberofvertices) {
          end2 = p->vertexlist[j];
        } else {
          end2 = p->vertexlist[0];  // Form a loop from last to first.
        }
        if ((end2 < in->firstnumber) ||
            (end2 >= in->firstnumber + in->numberofpoints)) {
          if (!b->quiet) {
            printf("Warning:  Invalid vertex %d in polygon %d", end2, i + 1);
            printf(" in facet %d.\n", shmark);
          }
        } else {
          if (end1 != end2) {
            // 'end1' and 'end2' form a segment.
            tend = idx2verlist[end2];
            // Add tstart to V if it haven't been added yet.
            if (!pinfected(tend)) {
              pinfect(tend);
              ptlist->newindex((void **) &pnewpt);
              *pnewpt = tend;
            }
            // Save the segment in S (conlist).
            conlist->newindex((void **) &cons);
            cons[0] = tstart;
            cons[1] = tend;
            // Set the start for next continuous segment.
            end1 = end2;
            tstart = tend;
          } else {
            // Two identical vertices mean an isolated vertex of F.
            if (p->numberofvertices > 2) {
              // This may be an error in the input, anyway, we can continue
              //   by simply skipping this segment.
              if (!b->quiet) {
                printf("Warning:  Polygon %d has two identical verts", i + 1);
                printf(" in facet %d.\n", shmark);
              }
            } 
            // Ignore this vertex.
          }
        }
        // Is the polygon degenerate (a segment or a vertex)?
        if (p->numberofvertices == 2) break;
      }
    }
    // Unmark vertices.
    for (i = 0; i < ptlist->objects; i++) {
      pnewpt = (point *) fastlookup(ptlist, i);
      puninfect(*pnewpt);
    }

    // Triangulate F into a CDT.
    // If in->facetmarklist is NULL, use the default marker -1. 
    triangulate(in->facetmarkerlist ? in->facetmarkerlist[shmark - 1] : -1,
                ptlist, conlist, f->numberofholes, f->holelist);

    // Clear working lists.
    ptlist->restart();
    conlist->restart();
  }

  if (!b->diagnose) {
    // Remove redundant segments and build the face links.
    unifysegments();
    if (in->numberofedges > 0) { 
      // There are input segments. Insert them.
      identifyinputedges(idx2verlist);
    }
    if (!b->psc && !b->nomergefacet && 
        (!b->nobisect || (b->nobisect && !b->nobisect_nomerge))) {
      // Merge coplanar facets.
      mergefacets();
    }
  }

  if (b->object == tetgenbehavior::STL) {
    // Remove redundant vertices (for .stl input mesh).
    jettisonnodes();
  }

  if (b->verbose) {
    printf("  %ld (%ld) subfaces (segments).\n", subfaces->items, 
           subsegs->items);
  }

  // The total number of iunput segments.
  insegments = subsegs->items;

  delete [] idx2verlist;
  delete ptlist;
  delete conlist;
}